

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::timestamp_t,double,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::JulianDayOperator>>
               (timestamp_t *ldata,double *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong idx;
  idx_t i;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      dVar7 = DatePart::PartOperator<duckdb::DatePart::JulianDayOperator>::
              Operation<duckdb::timestamp_t,double>
                        ((timestamp_t)ldata[iVar4].value,result_mask,iVar4,dataptr);
      result_data[iVar4] = dVar7;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    iVar4 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = iVar4 + 0x40;
        if (count <= iVar4 + 0x40) {
          uVar6 = count;
        }
LAB_006df0f3:
        for (; idx = iVar4, iVar4 < uVar6; iVar4 = iVar4 + 1) {
          dVar7 = DatePart::PartOperator<duckdb::DatePart::JulianDayOperator>::
                  Operation<duckdb::timestamp_t,double>
                            ((timestamp_t)ldata[iVar4].value,result_mask,iVar4,dataptr);
          result_data[iVar4] = dVar7;
        }
      }
      else {
        uVar2 = puVar1[uVar3];
        uVar6 = iVar4 + 0x40;
        if (count <= iVar4 + 0x40) {
          uVar6 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_006df0f3;
        idx = uVar6;
        if (uVar2 != 0) {
          for (uVar5 = 0; idx = iVar4 + uVar5, idx < uVar6; uVar5 = uVar5 + 1) {
            if ((uVar2 >> (uVar5 & 0x3f) & 1) != 0) {
              dVar7 = DatePart::PartOperator<duckdb::DatePart::JulianDayOperator>::
                      Operation<duckdb::timestamp_t,double>
                                ((timestamp_t)ldata[iVar4 + uVar5].value,result_mask,idx,dataptr);
              result_data[iVar4 + uVar5] = dVar7;
            }
          }
        }
      }
      iVar4 = idx;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}